

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O0

void __thiscall YacclabTests::~YacclabTests(YacclabTests *this)

{
  int iVar1;
  reference s;
  Labeling *pLVar2;
  undefined4 extraout_var;
  YacclabTests *this_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->mode_cfg_->ccl_existing_algorithms,0);
  pLVar2 = LabelingMapSingleton::GetLabeling(s);
  iVar1 = (*pLVar2->_vptr_Labeling[9])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))();
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
  ::~map(&this->memory_accesses_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
  ::~map(&this->average_ws_results_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
  ::~map(&this->granularity_results_);
  cv::Mat_<double>::~Mat_(&this->density_results_);
  cv::Mat_<double>::~Mat_(&this->average_results_);
  filesystem::path::~path(&this->output_path);
  OutputBox::~OutputBox(&this->ob_);
  return;
}

Assistant:

~YacclabTests() {
        LabelingMapSingleton::GetLabeling(mode_cfg_.ccl_existing_algorithms[0])->GetInput()->Release();
    }